

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O2

void onquest(void)

{
  boolean bVar1;
  s_level *psVar2;
  int iStack_20;
  
  if ((((u.uevent._0_1_ & 0x20) == 0) && (bVar1 = on_level(&u.uz0,&u.uz), bVar1 == '\0')) &&
     (psVar2 = Is_special(&u.uz), psVar2 != (s_level *)0x0)) {
    bVar1 = on_level(&u.uz,&dungeon_topology.d_qstart_level);
    if (bVar1 == '\0') {
      bVar1 = on_level(&u.uz,&dungeon_topology.d_qlocate_level);
      if ((bVar1 == '\0') || (u.uz.dlevel <= u.uz0.dlevel)) {
        bVar1 = on_level(&u.uz,&dungeon_topology.d_nemesis_level);
        if ((bVar1 != '\0') && (((uint)quest_status._0_4_ >> 0xe & 1) == 0)) {
          if ((quest_status._0_4_ & 0x1c00) == 0) {
            qt_pager(0x28);
            quest_status._0_4_ = quest_status._0_4_ & 0xffffe3ff | 0x400;
          }
          else {
            qt_pager(0x29);
            if ((~quest_status._0_4_ & 0x1c00) != 0) {
              quest_status._0_4_ =
                   quest_status._0_4_ & 0xffffe3ff | quest_status._0_4_ + 0x400 & 0x1c00;
            }
          }
        }
      }
      else if (quest_status._0_1_ < '\0') {
        if (((uint)quest_status._0_4_ >> 0xe & 1) == 0) {
          iStack_20 = 0x24;
          goto LAB_0021b5b2;
        }
      }
      else {
        qt_pager(0x23);
        quest_status._0_4_ = quest_status._0_4_ | 0x80;
      }
    }
    else if ((quest_status._0_4_ & 1) == 0) {
      qt_pager(1);
      quest_status._0_4_ = quest_status._0_4_ | 1;
    }
    else if ((u.uz0.dnum != u.uz.dnum) || (u.uz0.dlevel < u.uz.dlevel)) {
      if ((quest_status._0_4_ & 0x1c) < 0xc) {
        iStack_20 = 2;
      }
      else {
        iStack_20 = 3;
      }
LAB_0021b5b2:
      qt_pager(iStack_20);
      return;
    }
  }
  return;
}

Assistant:

void onquest(void)
{
	if (u.uevent.qcompleted || Not_firsttime) return;
	if (!Is_special(&u.uz)) return;

	if (Is_qstart(&u.uz)) on_start();
	else if (Is_qlocate(&u.uz) && u.uz.dlevel > u.uz0.dlevel) on_locate();
	else if (Is_nemesis(&u.uz)) on_goal();
	return;
}